

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O1

size_t trc_print_ids(Curl_easy *data,char *buf,size_t maxlen)

{
  int iVar1;
  long lVar2;
  char *format;
  curl_off_t *pcVar3;
  
  pcVar3 = &(data->state).recent_conn_id;
  if (data->conn != (connectdata *)0x0) {
    pcVar3 = &data->conn->connection_id;
  }
  lVar2 = *pcVar3;
  if (data->id < 0) {
    if (lVar2 < 0) {
      iVar1 = curl_msnprintf(buf,0x800,"[x-x] ");
      goto LAB_00122e1f;
    }
    format = "[x-%ld] ";
  }
  else {
    if (-1 < lVar2) {
      iVar1 = curl_msnprintf(buf,0x800,"[%ld-%ld] ");
      goto LAB_00122e1f;
    }
    format = "[%ld-x] ";
    lVar2 = data->id;
  }
  iVar1 = curl_msnprintf(buf,0x800,format,lVar2);
LAB_00122e1f:
  return (long)iVar1;
}

Assistant:

static size_t trc_print_ids(struct Curl_easy *data, char *buf, size_t maxlen)
{
  curl_off_t cid = data->conn ?
                   data->conn->connection_id : data->state.recent_conn_id;
  if(data->id >= 0) {
    if(cid >= 0)
      return msnprintf(buf, maxlen, CURL_TRC_FMT_IDSDC, data->id, cid);
    else
      return msnprintf(buf, maxlen, CURL_TRC_FMT_IDSD, data->id);
  }
  else if(cid >= 0)
    return msnprintf(buf, maxlen, CURL_TRC_FMT_IDSC, cid);
  else {
    return msnprintf(buf, maxlen, "[x-x] ");
  }
}